

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

string * __thiscall
CoreML::dataTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,ArrayFeatureType_ArrayDataType dataType)

{
  allocator *paVar1;
  int iVar2;
  char *pcVar3;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar2 = (int)this;
  if (iVar2 != 0) {
    if (iVar2 == 0x10020) {
      pcVar3 = "Float32";
      paVar1 = &local_b;
      goto LAB_001ff7a1;
    }
    if (iVar2 == 0x10040) {
      pcVar3 = "Double";
      paVar1 = &local_a;
      goto LAB_001ff7a1;
    }
    if (iVar2 != 0x7fffffff) {
      pcVar3 = "Int32";
      paVar1 = &local_9;
      goto LAB_001ff7a1;
    }
  }
  pcVar3 = "Invalid";
  paVar1 = &local_c;
LAB_001ff7a1:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string dataTypeToString(Specification::ArrayFeatureType_ArrayDataType dataType) {
        switch (dataType) {
            case Specification::ArrayFeatureType_ArrayDataType_INT32:
                return "Int32";
            case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                return "Double";
            case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                return "Float32";
            case Specification::ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE:
            case Specification::ArrayFeatureType_ArrayDataType_ArrayFeatureType_ArrayDataType_INT_MAX_SENTINEL_DO_NOT_USE_:
            case Specification::ArrayFeatureType_ArrayDataType_ArrayFeatureType_ArrayDataType_INT_MIN_SENTINEL_DO_NOT_USE_:
                return "Invalid";
        }
    }